

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O0

REF_STATUS
ref_sort_search_glob(REF_INT n,REF_GLOB *ascending_list,REF_GLOB target,REF_INT *position)

{
  int local_34;
  int local_30;
  REF_INT mid;
  REF_INT upper;
  REF_INT lower;
  REF_INT *position_local;
  REF_GLOB target_local;
  REF_GLOB *ascending_list_local;
  REF_INT n_local;
  
  *position = -1;
  if (n < 1) {
    ascending_list_local._4_4_ = 5;
  }
  else if ((target < *ascending_list) || (ascending_list[n + -1] < target)) {
    ascending_list_local._4_4_ = 5;
  }
  else {
    mid = 0;
    local_30 = n + -1;
    local_34 = n >> 1;
    if (target == *ascending_list) {
      *position = 0;
      ascending_list_local._4_4_ = 0;
    }
    else if (target == ascending_list[local_30]) {
      *position = local_30;
      ascending_list_local._4_4_ = 0;
    }
    else {
      while (mid < local_34 && local_34 < local_30) {
        if (target < ascending_list[local_34]) {
          local_30 = local_34;
        }
        else {
          if (target == ascending_list[local_34]) {
            *position = local_34;
            return 0;
          }
          mid = local_34;
        }
        local_34 = mid + local_30 >> 1;
      }
      ascending_list_local._4_4_ = 5;
    }
  }
  return ascending_list_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_sort_search_glob(REF_INT n, REF_GLOB *ascending_list,
                                        REF_GLOB target, REF_INT *position) {
  REF_INT lower, upper, mid;

  *position = REF_EMPTY;

  if (n < 1) return REF_NOT_FOUND;

  if (target < ascending_list[0] || target > ascending_list[n - 1])
    return REF_NOT_FOUND;

  lower = 0;
  upper = n - 1;
  mid = n >> 1; /* fast divide by two */

  if (target == ascending_list[lower]) {
    *position = lower;
    return REF_SUCCESS;
  }
  if (target == ascending_list[upper]) {
    *position = upper;
    return REF_SUCCESS;
  }

  while ((lower < mid) && (mid < upper)) {
    if (target >= ascending_list[mid]) {
      if (target == ascending_list[mid]) {
        *position = mid;
        return REF_SUCCESS;
      }
      lower = mid;
    } else {
      upper = mid;
    }
    mid = (lower + upper) >> 1;
  }

  return REF_NOT_FOUND;
}